

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::ServiceOptions::~ServiceOptions(ServiceOptions *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

ServiceOptions::~ServiceOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.ServiceOptions)
  SharedDtor(*this);
}